

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

int adios2::utils::printVariableInfo<unsigned_short>
              (Engine *fp,IO *io,Variable<unsigned_short> *variable)

{
  DataType adiosvartype;
  pointer puVar1;
  bool bVar2;
  FILE *pFVar3;
  undefined8 __val;
  char cVar4;
  char cVar5;
  ulong uVar6;
  char *pcVar7;
  pointer puVar8;
  ulong uVar9;
  int iVar10;
  pointer *ppuVar11;
  Variable<unsigned_short> *data;
  ulong uVar12;
  unsigned_short value;
  Dims d;
  undefined1 local_88 [40];
  Dims local_60;
  IO *local_40;
  Engine *local_38;
  
  uVar6 = adios2::core::VariableBase::GetAvailableStepsCount();
  uVar12 = 1;
  if (timestep == '\0') {
    uVar12 = uVar6;
  }
  adiosvartype = *(DataType *)(variable + 0x28);
  if (((uVar12 == 1) && (variable[0x54] != (Variable<unsigned_short>)0x0)) &&
     (*(int *)(variable + 0x40) != 2)) {
    fwrite("  scalar",8,1,outf);
    if ((longopt != '\x01') || (timestep != '\0')) goto LAB_0011da71;
    fwrite(" = ",3,1,outf);
    data = (Variable<unsigned_short> *)local_88;
    adios2::core::Engine::Get<unsigned_short>((Variable *)fp,(ushort *)variable,(Mode)data);
  }
  else {
    fwrite("  ",2,1,outf);
    if (1 < uVar12) {
      fprintf(outf,"%zu*",uVar12);
    }
    if (*(int *)(variable + 0x40) == 5) {
      local_38 = fp;
      get_local_array_signature<unsigned_short>
                ((pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )local_88,fp,io,variable);
      __val = local_88._0_8_;
      pFVar3 = outf;
      if ((char *)local_88._0_8_ == (char *)0x0) {
        fprintf(outf,"[%s]*","__");
      }
      else {
        cVar5 = '\x01';
        if ((char *)0x9 < (ulong)local_88._0_8_) {
          pcVar7 = (char *)local_88._0_8_;
          cVar4 = '\x04';
          do {
            cVar5 = cVar4;
            if (pcVar7 < (char *)0x64) {
              cVar5 = cVar5 + -2;
              goto LAB_0011d731;
            }
            if (pcVar7 < (char *)0x3e8) {
              cVar5 = cVar5 + -1;
              goto LAB_0011d731;
            }
            if (pcVar7 < (char *)0x2710) goto LAB_0011d731;
            bVar2 = (char *)0x1869f < pcVar7;
            pcVar7 = (char *)((ulong)pcVar7 / 10000);
            cVar4 = cVar5 + '\x04';
          } while (bVar2);
          cVar5 = cVar5 + '\x01';
        }
LAB_0011d731:
        ppuVar11 = &local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar11;
        std::__cxx11::string::_M_construct((ulong)&local_60,cVar5);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_60.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (uint)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish,__val);
        fprintf(pFVar3,"[%s]*",
                local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
        if ((pointer *)
            local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar11) {
          operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      pFVar3 = outf;
      uVar12 = *(ulong *)CONCAT44(local_88._12_4_,local_88._8_4_);
      if (uVar12 == 0) {
        local_40 = io;
        fprintf(outf,"{%s","__");
      }
      else {
        cVar5 = '\x01';
        if (9 < uVar12) {
          uVar6 = uVar12;
          cVar4 = '\x04';
          do {
            cVar5 = cVar4;
            if (uVar6 < 100) {
              cVar5 = cVar5 + -2;
              goto LAB_0011d80b;
            }
            if (uVar6 < 1000) {
              cVar5 = cVar5 + -1;
              goto LAB_0011d80b;
            }
            if (uVar6 < 10000) goto LAB_0011d80b;
            bVar2 = 99999 < uVar6;
            uVar6 = uVar6 / 10000;
            cVar4 = cVar5 + '\x04';
          } while (bVar2);
          cVar5 = cVar5 + '\x01';
        }
LAB_0011d80b:
        ppuVar11 = &local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar11;
        local_40 = io;
        std::__cxx11::string::_M_construct((ulong)&local_60,cVar5);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_60.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                   (uint)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish,uVar12);
        fprintf(pFVar3,"{%s",
                local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
        if ((pointer *)
            local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar11) {
          operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (8 < (ulong)(*(long *)(variable + 0x90) - *(long *)(variable + 0x88))) {
        uVar12 = 1;
        ppuVar11 = &local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        do {
          pFVar3 = outf;
          uVar6 = *(ulong *)(CONCAT44(local_88._12_4_,local_88._8_4_) + uVar12 * 8);
          if (uVar6 == 0) {
            fprintf(outf,", %s","__");
          }
          else {
            cVar5 = '\x01';
            if (9 < uVar6) {
              uVar9 = uVar6;
              cVar4 = '\x04';
              do {
                cVar5 = cVar4;
                if (uVar9 < 100) {
                  cVar5 = cVar5 + -2;
                  goto LAB_0011d904;
                }
                if (uVar9 < 1000) {
                  cVar5 = cVar5 + -1;
                  goto LAB_0011d904;
                }
                if (uVar9 < 10000) goto LAB_0011d904;
                bVar2 = 99999 < uVar9;
                uVar9 = uVar9 / 10000;
                cVar4 = cVar5 + '\x04';
              } while (bVar2);
              cVar5 = cVar5 + '\x01';
            }
LAB_0011d904:
            local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppuVar11;
            std::__cxx11::string::_M_construct((ulong)&local_60,cVar5);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_60.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                       (uint)local_60.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,uVar6);
            fprintf(pFVar3,", %s",
                    local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
            if ((pointer *)
                local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != ppuVar11) {
              operator_delete(local_60.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(*(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3));
      }
      fputc(0x7d,outf);
      ppuVar11 = (pointer *)CONCAT44(local_88._12_4_,local_88._8_4_);
LAB_0011d981:
      io = local_40;
      fp = local_38;
      if (ppuVar11 != (pointer *)0x0) {
        operator_delete(ppuVar11);
        io = local_40;
        fp = local_38;
      }
    }
    else {
      if (*(int *)(variable + 0x40) == 2) {
        local_38 = fp;
        get_global_array_signature<unsigned_short>(&local_60,fp,io,variable);
        pFVar3 = outf;
        puVar1 = (pointer)*local_60.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
        if (puVar1 == (pointer)0x0) {
          local_40 = io;
          fprintf(outf,"{%s","__");
        }
        else {
          cVar5 = '\x01';
          if ((pointer)0x9 < puVar1) {
            puVar8 = puVar1;
            cVar4 = '\x04';
            do {
              cVar5 = cVar4;
              if (puVar8 < (pointer)0x64) {
                cVar5 = cVar5 + -2;
                goto LAB_0011d5c0;
              }
              if (puVar8 < (pointer)0x3e8) {
                cVar5 = cVar5 + -1;
                goto LAB_0011d5c0;
              }
              if (puVar8 < (pointer)0x2710) goto LAB_0011d5c0;
              bVar2 = (pointer)0x1869f < puVar8;
              puVar8 = (pointer)((ulong)puVar8 / 10000);
              cVar4 = cVar5 + '\x04';
            } while (bVar2);
            cVar5 = cVar5 + '\x01';
          }
LAB_0011d5c0:
          local_88._0_8_ = local_88 + 0x10;
          local_40 = io;
          std::__cxx11::string::_M_construct((ulong)local_88,cVar5);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_88._0_8_,local_88._8_4_,(unsigned_long)puVar1);
          fprintf(pFVar3,"{%s",local_88._0_8_);
          if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
            operator_delete((void *)local_88._0_8_);
          }
        }
        if (8 < (ulong)(*(long *)(variable + 0x60) - *(long *)(variable + 0x58))) {
          uVar12 = 1;
          do {
            pFVar3 = outf;
            puVar1 = (pointer)local_60.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar12];
            if (puVar1 == (pointer)0x0) {
              fprintf(outf,", %s","__");
            }
            else {
              cVar5 = '\x01';
              if ((pointer)0x9 < puVar1) {
                puVar8 = puVar1;
                cVar4 = '\x04';
                do {
                  cVar5 = cVar4;
                  if (puVar8 < (pointer)0x64) {
                    cVar5 = cVar5 + -2;
                    goto LAB_0011d6b3;
                  }
                  if (puVar8 < (pointer)0x3e8) {
                    cVar5 = cVar5 + -1;
                    goto LAB_0011d6b3;
                  }
                  if (puVar8 < (pointer)0x2710) goto LAB_0011d6b3;
                  bVar2 = (pointer)0x1869f < puVar8;
                  puVar8 = (pointer)((ulong)puVar8 / 10000);
                  cVar4 = cVar5 + '\x04';
                } while (bVar2);
                cVar5 = cVar5 + '\x01';
              }
LAB_0011d6b3:
              local_88._0_8_ = local_88 + 0x10;
              std::__cxx11::string::_M_construct((ulong)local_88,cVar5);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_88._0_8_,local_88._8_4_,(unsigned_long)puVar1);
              fprintf(pFVar3,", %s",local_88._0_8_);
              if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                operator_delete((void *)local_88._0_8_);
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(*(long *)(variable + 0x60) - *(long *)(variable + 0x58) >> 3));
        }
        fputc(0x7d,outf);
        ppuVar11 = (pointer *)
                   local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        goto LAB_0011d981;
      }
      fwrite("scalar",6,1,outf);
    }
    if ((longopt != '\x01') || (timestep != '\0')) goto LAB_0011da71;
    cVar5 = (**(code **)(*(long *)fp + 0x70))(fp,variable,0xffffffffffffffff,local_88);
    fwrite(" = ",3,1,outf);
    if (cVar5 == '\0') {
      print_data(variable + 0x228,0,adiosvartype,false,false);
      fwrite(" / ",3,1,outf);
      data = variable + 0x22a;
    }
    else {
      print_data(local_88,0,adiosvartype,false,false);
      fwrite(" / ",3,1,outf);
      data = (Variable<unsigned_short> *)(local_88 + 0x10);
    }
  }
  print_data(data,0,adiosvartype,false,false);
LAB_0011da71:
  fputc(10,outf);
  if (show_decomp == '\x01') {
    if (timestep == '\x01') {
      print_decomp_singlestep<unsigned_short>(fp,io,variable);
    }
    else {
      print_decomp<unsigned_short>(fp,io,variable);
    }
  }
  if (show_derived_expr == '\x01') {
    (**(code **)(*(long *)fp + 0x78))(local_88,fp,variable);
    if (CONCAT44(local_88._12_4_,local_88._8_4_) != 0) {
      fprintf(outf,"    Derived variable with expression: %s\n",local_88._0_8_);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  iVar10 = 0;
  if ((dump == '\x01') && (iVar10 = 0, show_decomp == '\0')) {
    adios2::core::VariableBase::SetAccuracy((Accuracy *)variable);
    if (*(int *)(variable + 0x40) == 5) {
      if (timestep == '\x01') {
        print_decomp_singlestep<unsigned_short>(fp,io,variable);
      }
      else {
        print_decomp<unsigned_short>(fp,io,variable);
      }
      iVar10 = 0;
    }
    else {
      iVar10 = readVar<unsigned_short>(fp,io,variable);
    }
    fputc(10,outf);
  }
  return iVar10;
}

Assistant:

int printVariableInfo(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    size_t nsteps = variable->GetAvailableStepsCount();
    if (timestep)
    {
        nsteps = 1;
    }
    DataType adiosvartype = variable->m_Type;
    int retval = 0;

    bool isGlobalValue = (nsteps == 1);
    isGlobalValue &= variable->m_SingleValue;
    isGlobalValue &= (variable->m_ShapeID != ShapeID::GlobalArray);

    if (!isGlobalValue)
    {
        fprintf(outf, "  ");

        if (nsteps > 1)
            fprintf(outf, "%zu*", nsteps);

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            Dims d = get_global_array_signature(fp, io, variable);
            fprintf(outf, "{%s", d[0] > 0 ? std::to_string(d[0]).c_str() : "__");
            for (size_t j = 1; j < variable->m_Shape.size(); j++)
            {
                fprintf(outf, ", %s", d[j] > 0 ? std::to_string(d[j]).c_str() : "__");
            }
            fprintf(outf, "}");
        }
        else if (variable->m_ShapeID == ShapeID::LocalArray)
        {
            std::pair<size_t, Dims> signo = get_local_array_signature(fp, io, variable);
            Dims &d = signo.second;
            fprintf(outf, "[%s]*", signo.first > 0 ? std::to_string(signo.first).c_str() : "__");
            fprintf(outf, "{%s", d[0] > 0 ? std::to_string(d[0]).c_str() : "__");
            for (size_t j = 1; j < variable->m_Count.size(); j++)
            {
                fprintf(outf, ", %s", d[j] > 0 ? std::to_string(d[j]).c_str() : "__");
            }
            fprintf(outf, "}");
        }
        else
        {
            fprintf(outf, "scalar");
        }
#if 0
        if (longopt || plot)
        {
            adios_inq_var_stat(fp, vi, timestep && timed, show_decomp);
        }

        if (plot && vi->statistics && vi->statistics->histogram)
        {
            print_data_hist(vi, &names[n][1]);
        }
#endif
        if (longopt /* TODO: && variable->has_statistics */)
        {
            if (timestep == false)
            {
                MinMaxStruct MinMax;
                try
                {
                    if (fp->VariableMinMax(*variable, DefaultSizeT, MinMax))
                    {
                        fprintf(outf, " = ");
                        print_data(&MinMax.MinUnion, 0, adiosvartype, false);
                        fprintf(outf, " / ");
                        print_data(&MinMax.MaxUnion, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, " = ");
                        print_data(&variable->m_Min, 0, adiosvartype, false);
                        fprintf(outf, " / ");
                        print_data(&variable->m_Max, 0, adiosvartype, false);
                    }
                    // fprintf(outf," {MIN / MAX} ");
                }
                catch (std::logic_error &)
                {
                }
            }
#if 0
            else
            {
                int time_start = 0, time_end = vi->nsteps;

                if (start != NULL)
                {
                    if (istart[0] >= 0)
                        time_start = istart[0];
                    else
                        time_start = vi->nsteps - 1 + (int)istart[0];
                }

                if (count != NULL)
                {
                    if (icount[0] > 0)
                        time_end = time_start + (int)icount[0];
                    else
                        time_end = vi->nsteps + (int)icount[0] + 1;
                }

                if (time_start < 0 || time_start >= vi->nsteps)
                {
                    fprintf(stderr, "Error when reading variable %s. "
                                    "errno=%d : Variable (id=%d) has "
                                    "no data at %d time step\n",
                            names[n], 15, vi->varid, time_start);
                    bpexit(15, fp);
                }

                if (time_end < 0 || time_end > vi->nsteps)
                {
                    fprintf(stderr, "Error when reading variable %s. "
                                    "errno=%d : Variable (id=%d) has "
                                    "no data at %d time step\n",
                            names[n], 15, vi->varid, time_end);
                    bpexit(16, fp);
                }

                static char *indent_char = " ";
                int indent_len = 11;

                /* Start - Print the headers of statistics first */
                fprintf(outf, "\n%-*s", indent_len + 7, indent_char);
                fprintf(outf, "%10s  ", "MIN");
                fprintf(outf, "%10s  ", "MAX");
                fprintf(outf, "%10s  ", "AVG");
                fprintf(outf, "%10s  ", "STD DEV");

                /* End - Print the headers of statistics first */

                void *min, *max, *avg, *std_dev;
                DataType vt = vartype;
                struct ADIOS_STAT_STEP *s = vi->statistics->steps;
                if (vi->type == DataType::FloatComplex ||
                    vi->type == DataType::DoubleComplex)
                    vt = DataType::Double;
                fprintf(outf, "\n%-*sglobal:", indent_len, indent_char);
                print_data_characteristics(
                    vi->statistics->min, vi->statistics->max,
                    vi->statistics->avg, vi->statistics->std_dev, vt, false);

                for (i = time_start; i < time_end; i++)
                {
                    min = max = avg = std_dev = 0;
                    if (s->maxs && s->maxs[i])
                        max = s->maxs[i];
                    if (s->mins && s->mins[i])
                        min = s->mins[i];
                    if (s->avgs && s->avgs[i])
                        avg = s->avgs[i];
                    if (s->std_devs && s->std_devs[i])
                        std_dev = s->std_devs[i];

                    // Align the output, previous lines has atleast
                    // (maxlen + strlen(names[n])) characters
                    // Better way to printf N spaces?
                    fprintf(outf, "\n%-*st%-5d:", indent_len, indent_char, i);
                    print_data_characteristics(min, max, avg, std_dev, vt,
                                               false);
                }
                fprintf(outf, "\n");
            }
#endif
        } // longopt && vi->statistics
        fprintf(outf, "\n");

        if (show_decomp)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
    }
    else
    {
        // single GlobalValue without timesteps
        fprintf(outf, "  scalar");
        if (longopt && !timestep)
        {
            fprintf(outf, " = ");
            T value;
            fp->Get(*variable, value, adios2::Mode::Sync);
            print_data(&value, 0, adiosvartype, false);
        }
        fprintf(outf, "\n");

        if (show_decomp)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
    }

    if (show_derived_expr)
    {
        std::string ExprStr = fp->VariableExprStr(*variable);
        if (ExprStr.size() > 0)
        {
            fprintf(outf, "    Derived variable with expression: %s\n", ExprStr.c_str());
        }
    }

    if (dump && !show_decomp)
    {
        variable->SetAccuracy(accuracy);
        // print variable content
        if (variable->m_ShapeID == ShapeID::LocalArray)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
        else
        {
            retval = readVar(fp, io, variable);
        }
        fprintf(outf, "\n");
    }
    return retval;
}